

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

void destroy_context(Context_conflict *ctx)

{
  void *pvVar1;
  MOJOSHADER_free local_28;
  void *d;
  MOJOSHADER_free f;
  Context_conflict *ctx_local;
  
  if (ctx != (Context_conflict *)0x0) {
    if (ctx->free == (MOJOSHADER_free)0x0) {
      local_28 = MOJOSHADER_internal_free;
    }
    else {
      local_28 = ctx->free;
    }
    pvVar1 = ctx->malloc_data;
    preprocessor_end(ctx->preprocessor);
    errorlist_destroy(ctx->errors);
    buffer_destroy(ctx->ctab);
    buffer_destroy(ctx->token_to_source);
    buffer_destroy(ctx->output);
    (*local_28)(ctx,pvVar1);
  }
  return;
}

Assistant:

static void destroy_context(Context *ctx)
{
    if (ctx != NULL)
    {
        MOJOSHADER_free f = ((ctx->free != NULL) ? ctx->free : MOJOSHADER_internal_free);
        void *d = ctx->malloc_data;
        preprocessor_end(ctx->preprocessor);
        errorlist_destroy(ctx->errors);
        buffer_destroy(ctx->ctab);
        buffer_destroy(ctx->token_to_source);
        buffer_destroy(ctx->output);
        f(ctx, d);
    } // if
}